

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

void __thiscall maths::Matrix::readSolutionsFromRREF(Matrix *this,ostream *os)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  void *pvVar5;
  double *pdVar6;
  ostream *in_RSI;
  int *in_RDI;
  int j_1;
  bool specialCreated;
  bool pivotFound;
  int i_1;
  Matrix special;
  Matrix particular;
  int j;
  bool allZeros;
  int i;
  bool doneSearching;
  bool hasSolutions;
  Matrix R;
  Matrix *in_stack_fffffffffffffea8;
  ostream *in_stack_fffffffffffffeb0;
  Matrix *in_stack_fffffffffffffeb8;
  Matrix *in_stack_fffffffffffffec0;
  Matrix *in_stack_fffffffffffffed0;
  Matrix *in_stack_fffffffffffffed8;
  int local_6c;
  int local_64;
  Matrix local_60;
  Matrix local_50 [2];
  int local_30;
  byte local_29;
  int local_28;
  byte local_22;
  byte local_21;
  Matrix local_20;
  ostream *local_10;
  
  local_10 = in_RSI;
  Matrix(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_21 = 1;
  local_22 = 0;
  local_28 = 0;
  do {
    bVar2 = false;
    if ((local_22 & 1) == 0) {
      bVar2 = local_28 < *in_RDI;
    }
    if (!bVar2) {
      if ((local_22 & 1) == 0) {
        poVar4 = std::operator<<(local_10,"UNIQUE SOLUTION");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      if ((local_21 & 1) != 0) {
        Matrix(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (int)in_stack_fffffffffffffeb8);
        Matrix(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (int)in_stack_fffffffffffffeb8);
        for (local_64 = 0; local_64 < *in_RDI; local_64 = local_64 + 1) {
          bVar2 = false;
          bVar3 = false;
          for (local_6c = 0; local_6c < in_RDI[1] + -1; local_6c = local_6c + 1) {
            pdVar6 = operator()(&local_20,local_64,local_6c);
            if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) {
              if (bVar2) {
                if (!bVar3) {
                  Matrix(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                         (int)in_stack_fffffffffffffeb8);
                  operator=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                  ~Matrix(in_stack_fffffffffffffec0);
                  bVar3 = true;
                }
                pdVar6 = operator()(&local_20,local_64,local_6c);
                dVar1 = *pdVar6;
                pdVar6 = operator()(&local_60,local_6c,0);
                *pdVar6 = -dVar1;
              }
              else {
                bVar2 = true;
                pdVar6 = operator()(&local_20,local_64,in_RDI[1] + -1);
                dVar1 = *pdVar6;
                pdVar6 = operator()(local_50,local_6c,0);
                *pdVar6 = dVar1;
              }
            }
          }
          in_stack_fffffffffffffed8 = (Matrix *)std::operator<<(local_10,"Special solution:");
          in_stack_fffffffffffffed0 =
               (Matrix *)
               std::ostream::operator<<
                         (in_stack_fffffffffffffed8,std::endl<char,std::char_traits<char>>);
          poVar4 = operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        in_stack_fffffffffffffec0 = (Matrix *)std::operator<<(local_10,"Particular solution:");
        std::ostream::operator<<(in_stack_fffffffffffffec0,std::endl<char,std::char_traits<char>>);
        poVar4 = operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        ~Matrix(in_stack_fffffffffffffec0);
        ~Matrix(in_stack_fffffffffffffec0);
      }
      ~Matrix(in_stack_fffffffffffffec0);
      return;
    }
    local_29 = 1;
    for (local_30 = 0; local_30 < in_RDI[1] + -1; local_30 = local_30 + 1) {
      pdVar6 = operator()(&local_20,local_28,local_30);
      if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) {
        local_29 = 0;
      }
    }
    if ((local_29 & 1) == 0) {
LAB_0013a8cb:
      if ((local_29 & 1) != 0) {
        pdVar6 = operator()(&local_20,local_28,in_RDI[1] + -1);
        if ((*pdVar6 == 0.0) && (!NAN(*pdVar6))) {
          poVar4 = std::operator<<(local_10,"INFINITE SOLUTIONS");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          local_22 = 1;
          goto LAB_0013a9e9;
        }
      }
      if (*in_RDI < in_RDI[1] + -1) {
        poVar4 = std::operator<<(local_10,"INFINITE SOLUTIONS");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        local_22 = 1;
      }
    }
    else {
      pdVar6 = operator()(&local_20,local_28,in_RDI[1] + -1);
      if ((*pdVar6 == 0.0) && (!NAN(*pdVar6))) goto LAB_0013a8cb;
      local_21 = 0;
      poVar4 = std::operator<<(local_10,"NO SOLUTIONS");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      local_22 = 1;
    }
LAB_0013a9e9:
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void Matrix::readSolutionsFromRREF(ostream& os)
{
    Matrix R(*this);

    // print number of solutions
    bool hasSolutions = true;
    bool doneSearching = false;
    int i = 0;
    while (!doneSearching && i < rows_)
    {
        bool allZeros = true;
        for (int j = 0; j < cols_ - 1; ++j) {
            if (R(i, j) != 0)
                allZeros = false;
        }
        if (allZeros && R(i, cols_ - 1) != 0) {
            hasSolutions = false;
            os << "NO SOLUTIONS" << endl << endl;
            doneSearching = true;
        } else if (allZeros && R(i, cols_ - 1) == 0) {
            os << "INFINITE SOLUTIONS" << endl << endl;
            doneSearching = true;
        } else if (rows_ < cols_ - 1) {
            os << "INFINITE SOLUTIONS" << endl << endl;
            doneSearching = true;
        }
        i++;
    }
    if (!doneSearching)
        os << "UNIQUE SOLUTION" << endl << endl;

    // get solutions if they exist
    if (hasSolutions)
    {
        Matrix particular(cols_ - 1, 1);
        Matrix special(cols_ - 1, 1);

        for (int i = 0; i < rows_; ++i) {
            bool pivotFound = false;
            bool specialCreated = false;
            for (int j = 0; j < cols_ - 1; ++j) {
                if (R(i, j) != 0) {
                    // if pivot variable, add b to particular
                    if (!pivotFound) {
                        pivotFound = true;
                        particular(j, 0) = R(i, cols_ - 1);
                    } else { // otherwise, add to special solution
                        if (!specialCreated) {
                            special = Matrix(cols_ - 1, 1);
                            specialCreated = true;
                        }
                        special(j, 0) = -1 * R(i, j);
                    }
                }
            }
            os << "Special solution:" << endl << special << endl;
        }
        os << "Particular solution:" << endl << particular << endl;
    }
}